

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

void __thiscall EOClient::Tick(EOClient *this)

{
  string *data_00;
  uint *puVar1;
  PacketState PVar2;
  FILE *__stream;
  _List_node_base *p_Var3;
  size_type sVar4;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  uint uVar8;
  size_t sVar9;
  mapped_type *this_00;
  size_type __n;
  size_t __len;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  allocator<char> local_71;
  string data;
  string empty;
  
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  data.field_2._M_local_buf[0] = '\0';
  __stream = (FILE *)this->upload_fh;
  if (__stream != (FILE *)0x0) {
    uVar12 = this->upload_size - this->upload_pos;
    sVar11 = (this->super_Client).send_buffer_used;
    uVar10 = (this->super_Client).send_buffer._M_string_length - sVar11;
    if (uVar12 <= uVar10) {
      uVar10 = uVar12;
    }
    if (uVar10 == 0) {
      if (this->upload_size == this->upload_pos && sVar11 == 0) {
        fclose(__stream);
        this->upload_fh = (FILE *)0x0;
        this->upload_pos = 0;
        this->upload_size = 0;
        std::__cxx11::string::swap((string *)&(this->super_Client).send_buffer);
        sVar11 = this->send_buffer2_ppos;
        sVar5 = (this->super_Client).send_buffer_gpos;
        sVar6 = (this->super_Client).send_buffer_ppos;
        (this->super_Client).send_buffer_gpos = this->send_buffer2_gpos;
        (this->super_Client).send_buffer_ppos = sVar11;
        this->send_buffer2_gpos = sVar5;
        this->send_buffer2_ppos = sVar6;
        sVar11 = (this->super_Client).send_buffer_used;
        (this->super_Client).send_buffer_used = this->send_buffer2_used;
        this->send_buffer2_used = sVar11;
        empty._M_dataplus._M_p = (pointer)&empty.field_2;
        empty._M_string_length = 0;
        empty.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::swap((string *)&this->send_buffer2);
        std::__cxx11::string::~string((string *)&empty);
      }
    }
    else {
      sVar9 = fread((this->super_Client).send_buffer._M_dataplus._M_p +
                    (this->super_Client).send_buffer_ppos,1,uVar10,__stream);
      if (this->upload_type == FILE_MAP) {
        p_Var3 = (this->super_Client).server[1].clients.
                 super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev;
        std::__cxx11::string::string<std::allocator<char>>((string *)&empty,"GlobalPK",&local_71);
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var3[0x19]._M_prev,&empty);
        bVar7 = util::variant::GetBool(this_00);
        if (bVar7) {
          bVar7 = World::PKExcept((World *)(this->super_Client).server[1].clients.
                                           super__List_base<Client_*,_std::allocator<Client_*>_>.
                                           _M_impl._M_node.super__List_node_base._M_prev,
                                  (int)this->player->character->mapid);
          std::__cxx11::string::~string((string *)&empty);
          if (!bVar7) {
            uVar12 = this->upload_pos;
            uVar10 = uVar12 + sVar9;
            if ((uVar12 < 4) && (3 < uVar10)) {
              (this->super_Client).send_buffer._M_dataplus._M_p
              [((this->super_Client).send_buffer_ppos - uVar12) + 3] = -1;
              uVar12 = this->upload_pos;
              uVar10 = uVar12 + sVar9;
            }
            if ((uVar12 < 4) && (4 < uVar10)) {
              (this->super_Client).send_buffer._M_dataplus._M_p
              [((this->super_Client).send_buffer_ppos - uVar12) + 4] = '\x01';
              uVar12 = this->upload_pos;
              uVar10 = uVar12 + sVar9;
            }
            if ((uVar12 < 0x20) && (0x1f < uVar10)) {
              (this->super_Client).send_buffer._M_dataplus._M_p
              [((this->super_Client).send_buffer_ppos - uVar12) + 0x1f] = '\x04';
            }
          }
        }
        else {
          std::__cxx11::string::~string((string *)&empty);
        }
      }
      this->upload_pos = this->upload_pos + sVar9;
      auVar13._8_4_ = (int)sVar9;
      auVar13._0_8_ = sVar9;
      auVar13._12_4_ = (int)(sVar9 >> 0x20);
      (this->super_Client).send_buffer_ppos = sVar9 + (this->super_Client).send_buffer_ppos;
      (this->super_Client).send_buffer_used = auVar13._8_8_ + (this->super_Client).send_buffer_used;
    }
LAB_001268ec:
    std::__cxx11::string::~string((string *)&data);
    return;
  }
  sVar11 = (size_t)this->length;
  if (this->packet_state != ReadData) {
    sVar11 = 1;
  }
  Client::Recv_abi_cxx11_(&empty,&this->super_Client,sVar11);
  std::__cxx11::string::operator=((string *)&data,(string *)&empty);
  std::__cxx11::string::~string((string *)&empty);
  data_00 = &this->data;
  bVar7 = false;
LAB_00126650:
  if ((!bVar7) && (data._M_string_length != 0)) {
    PVar2 = this->packet_state;
    if (PVar2 == ReadLen1) goto LAB_0012668a;
    if (PVar2 == ReadLen2) goto LAB_001266bf;
    if (PVar2 == ReadData) goto LAB_0012671b;
    memset(data._M_dataplus._M_p,0,data._M_string_length);
    sVar9 = (this->data)._M_string_length;
    if (sVar9 != 0) {
      memset((data_00->_M_dataplus)._M_p,0,sVar9);
    }
    std::__cxx11::string::erase((ulong)&data,0);
    bVar7 = false;
    std::__cxx11::string::erase((ulong)data_00,0);
    goto LAB_0012680b;
  }
  goto LAB_001268ec;
LAB_0012668a:
  this->raw_length[0] = *data._M_dataplus._M_p;
  *data._M_dataplus._M_p = '\0';
  std::__cxx11::string::erase((ulong)&data,0);
  this->packet_state = ReadLen2;
  bVar7 = false;
  if (data._M_string_length != 0) {
LAB_001266bf:
    this->raw_length[1] = *data._M_dataplus._M_p;
    *data._M_dataplus._M_p = '\0';
    std::__cxx11::string::erase((ulong)&data,0);
    uVar8 = PacketProcessor::Number(this->raw_length[0],this->raw_length[1],0xfe,0xfe);
    this->length = uVar8;
    this->packet_state = ReadData;
    bVar7 = false;
    if (data._M_string_length != 0) {
LAB_0012671b:
      sVar4 = (this->data)._M_string_length;
      std::__cxx11::string::substr((ulong)&empty,(ulong)&data);
      std::__cxx11::string::append((string *)data_00);
      std::__cxx11::string::~string((string *)&empty);
      __n = data._M_string_length;
      if (this->length <= data._M_string_length) {
        __n = (ulong)this->length;
      }
      if (__n != 0) {
        memset(data._M_dataplus._M_p,0,__n);
      }
      std::__cxx11::string::erase((ulong)&data,0);
      puVar1 = &this->length;
      *puVar1 = *puVar1 + ((int)sVar4 - (int)(this->data)._M_string_length);
      bVar7 = false;
      if (*puVar1 == 0) {
        Execute(this,data_00);
        sVar9 = (this->data)._M_string_length;
        if (sVar9 != 0) {
          memset((data_00->_M_dataplus)._M_p,0,sVar9);
        }
        std::__cxx11::string::erase((ulong)data_00,0);
        bVar7 = true;
LAB_0012680b:
        this->packet_state = ReadLen1;
      }
    }
  }
  goto LAB_00126650;
}

Assistant:

int EOClient::GetSeqStart()
{
	return this->seq_start;
}